

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvref_common.h
# Opt level: O2

void lower_mv_precision(MV *mv,int allow_hp,int is_integer)

{
  ushort uVar1;
  short sVar2;
  ushort uVar3;
  
  if (is_integer != 0) {
    uVar3 = mv->row % 8;
    if (uVar3 != 0) {
      sVar2 = mv->row - uVar3;
      mv->row = sVar2;
      uVar1 = -uVar3;
      if (0 < (short)uVar3) {
        uVar1 = uVar3;
      }
      if (4 < uVar1) {
        mv->row = (ushort)(0 < (short)uVar3) * 0x10 + sVar2 + -8;
      }
    }
    uVar3 = mv->col % 8;
    if (uVar3 != 0) {
      sVar2 = mv->col - uVar3;
      mv->col = sVar2;
      uVar1 = -uVar3;
      if (0 < (short)uVar3) {
        uVar1 = uVar3;
      }
      if (4 < uVar1) {
        mv->col = (ushort)(0 < (short)uVar3) * 0x10 + sVar2 + -8;
      }
    }
    return;
  }
  if (allow_hp == 0) {
    uVar3 = mv->row;
    if ((uVar3 & 1) != 0) {
      mv->row = uVar3 + (ushort)((short)uVar3 < 1) * 2 + -1;
    }
    uVar3 = mv->col;
    if ((uVar3 & 1) != 0) {
      mv->col = uVar3 + (ushort)((short)uVar3 < 1) * 2 + -1;
      return;
    }
  }
  return;
}

Assistant:

static inline void lower_mv_precision(MV *mv, int allow_hp, int is_integer) {
  if (is_integer) {
    integer_mv_precision(mv);
  } else {
    if (!allow_hp) {
      if (mv->row & 1) mv->row += (mv->row > 0 ? -1 : 1);
      if (mv->col & 1) mv->col += (mv->col > 0 ? -1 : 1);
    }
  }
}